

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O2

int check_keyword(void)

{
  t_machine *ptVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  
  ptVar1 = machine;
  uVar4 = 0;
  piVar3 = &keyword[0].machine_type;
  iVar2 = 0;
  do {
    if ((iVar2 != 0) || (9 < uVar4)) {
      if (iVar2 != 0) {
        expr_lablptr = (t_symbol *)0x0;
        expr_lablcnt = 0;
      }
      return iVar2;
    }
    if ((*piVar3 == -1) || (ptVar1->type == *piVar3)) {
      iVar2 = strcasecmp(symbol,((anon_struct_16_3_aa3faf8f *)(piVar3 + -3))->name);
      if (iVar2 != 0) goto LAB_0010c0c0;
      iVar2 = piVar3[-1];
    }
    else {
LAB_0010c0c0:
      iVar2 = 0;
    }
    uVar4 = uVar4 + 1;
    piVar3 = piVar3 + 4;
  } while( true );
}

Assistant:

int
check_keyword(void)
{
	int op = 0;
	int i;
	/* check if its an assembler function */
	for(i=0; (0 == op) && (i<10); i++)
	{
		if(((MACHINE_ALL == keyword[i].machine_type) || (machine->type == keyword[i].machine_type)) && 
			(!strcasecmp(symbol, keyword[i].name)))
		{
			op = keyword[i].op;
		}
	}
	/* extra setup for functions that send back symbol infos */
	if(op)
	{
		expr_lablptr = NULL;
		expr_lablcnt = 0;
	}
	/* ok */
	return (op);
}